

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  ZSTD_compressedBlockState_t *pZVar1;
  U32 *pUVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  ZSTD_cwksp_alloc_phase_e ZVar4;
  uint *puVar5;
  long lVar6;
  ZSTD_CCtx *pZVar7;
  U32 *pUVar8;
  ZSTD_compressedBlockState_t *pZVar9;
  uint uVar10;
  void *alloc;
  ZSTD_CCtx *__s;
  
  if (((ulong)workspace & 7) != 0 || workspaceSize < 0xdf9) {
    return (ZSTD_CCtx *)0x0;
  }
  __s = (ZSTD_CCtx *)workspace;
  pZVar7 = (ZSTD_CCtx *)0xdf8;
  if ((long)workspaceSize < 0xdf8) {
    __s = (ZSTD_CCtx *)0x0;
    pZVar7 = (ZSTD_CCtx *)0x0;
  }
  if (__s == (ZSTD_CCtx *)0x0) {
    return (ZSTD_CCtx *)0x0;
  }
  pZVar3 = (ZSTD_compressedBlockState_t *)((long)workspace + workspaceSize);
  pZVar9 = (ZSTD_compressedBlockState_t *)((long)workspace + (long)pZVar7);
  memset(__s,0,0xdf8);
  (__s->workspace).workspace = workspace;
  (__s->workspace).workspaceEnd = pZVar3;
  (__s->workspace).objectEnd = pZVar9;
  (__s->workspace).tableEnd = pZVar9;
  (__s->workspace).tableValidEnd = pZVar9;
  (__s->workspace).allocStart = pZVar3;
  (__s->workspace).allocFailed = (long)workspaceSize < 0xdf8;
  (__s->workspace).workspaceOversizedDuration = 0;
  (__s->workspace).phase = ZSTD_cwksp_alloc_objects;
  (__s->workspace).isStatic = ZSTD_cwksp_static_alloc;
  __s->staticSize = workspaceSize;
  if (workspaceSize - (long)pZVar7 < 0x3db8) {
    return (ZSTD_CCtx *)0x0;
  }
  pZVar1 = pZVar9 + 1;
  if (pZVar3 < pZVar1) {
    (__s->workspace).allocFailed = '\x01';
    pZVar9 = (ZSTD_compressedBlockState_t *)0x0;
  }
  else {
    (__s->workspace).objectEnd = pZVar1;
    (__s->workspace).tableEnd = pZVar1;
    (__s->workspace).tableValidEnd = pZVar1;
  }
  (__s->blockState).prevCBlock = pZVar9;
  ZVar4 = (__s->workspace).phase;
  if (ZVar4 == ZSTD_cwksp_alloc_objects) {
    pZVar9 = (ZSTD_compressedBlockState_t *)(__s->workspace).objectEnd;
    pZVar3 = pZVar9 + 1;
    if (pZVar3 <= (ZSTD_compressedBlockState_t *)(__s->workspace).workspaceEnd) {
      (__s->workspace).objectEnd = pZVar3;
      (__s->workspace).tableEnd = pZVar3;
      (__s->workspace).tableValidEnd = pZVar3;
      goto LAB_001b2fe9;
    }
  }
  (__s->workspace).allocFailed = '\x01';
  pZVar9 = (ZSTD_compressedBlockState_t *)0x0;
LAB_001b2fe9:
  pUVar8 = (U32 *)(__s->workspace).objectEnd;
  (__s->blockState).nextCBlock = pZVar9;
  if ((ZVar4 == ZSTD_cwksp_alloc_objects) &&
     (pUVar2 = pUVar8 + 0x676, pUVar2 <= (__s->workspace).workspaceEnd)) {
    (__s->workspace).objectEnd = pUVar2;
    (__s->workspace).tableEnd = pUVar2;
    (__s->workspace).tableValidEnd = pUVar2;
  }
  else {
    (__s->workspace).allocFailed = '\x01';
    pUVar8 = (U32 *)0x0;
  }
  __s->entropyWorkspace = pUVar8;
  uVar10 = 0;
  puVar5 = (uint *)cpuid_basic_info(0);
  if (6 < *puVar5) {
    lVar6 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar10 = *(uint *)(lVar6 + 4) >> 8 & 1;
  }
  __s->bmi2 = uVar10;
  return __s;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void* workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) return NULL;

    ZSTD_memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, ENTROPY_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cctx->workspace, ENTROPY_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}